

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O2

bool __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::GetNextJointPolicyAndValueSpecific
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,
          shared_ptr<JointPolicyDiscretePure> *jpol,double *value)

{
  BGIPSolution *this_00;
  element_type *peVar1;
  bool bVar2;
  shared_ptr<JointPolicyDiscretePure> *psVar3;
  ostream *poVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  double in_XMM0_Qa;
  sp_counted_base *psVar6;
  shared_ptr<PartialJPDPValuePair> sVar7;
  shared_ptr<PartialJPDPValuePair> jppv;
  undefined1 local_68 [32];
  sp_counted_base *local_48;
  shared_count asStack_40 [2];
  
  if (this->_m_solved == false) {
    (*(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
      super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
      _vptr_BayesianGameIdenticalPayoffSolver[4])(this);
  }
  else {
    in_XMM0_Qa = ReSolve(this);
  }
  this_00 = &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
             super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
             _m_solution;
  bVar2 = BGIPSolution::IsEmptyJPPV(this_00);
  if (bVar2) {
    bVar2 = BGIPSolution::IsEmptyPJPDP(this_00);
    if (bVar2) {
      boost::shared_ptr<JointPolicyDiscretePure>::reset(jpol);
      *value = 0.0;
      bVar2 = false;
      goto LAB_0042338e;
    }
    sVar7 = BGIPSolution::GetNextSolutionPJPDP((BGIPSolution *)local_68);
    (*((Interface_ProblemToPolicyDiscrete *)local_68._0_8_)->_vptr_Interface_ProblemToPolicyDiscrete
      [2])(&local_48,local_68._0_8_,sVar7.pn.pi_.pi_);
    local_68._16_8_ = local_48;
    local_68._24_8_ = asStack_40[0].pi_;
    if (asStack_40[0].pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (asStack_40[0].pi_)->use_count_ = (asStack_40[0].pi_)->use_count_ + 1;
      UNLOCK();
    }
    psVar6 = local_48;
    psVar3 = boost::shared_ptr<JointPolicyDiscretePure>::operator=
                       (jpol,(shared_ptr<JointPolicyDiscretePure> *)(local_68 + 0x10));
    peVar1 = psVar3->px;
    boost::detail::shared_count::~shared_count((shared_count *)(local_68 + 0x18));
    boost::detail::shared_count::~shared_count(asStack_40);
    bVar2 = peVar1 != (element_type *)0x0;
    if (bVar2) {
      (*((Interface_ProblemToPolicyDiscrete *)local_68._0_8_)->
        _vptr_Interface_ProblemToPolicyDiscrete[3])();
      *value = (double)psVar6;
      BGIPSolution::PopNextSolutionPJPDP(this_00);
    }
  }
  else {
    BGIPSolution::GetNextSolutionJPPV((BGIPSolution *)local_68);
    local_68._16_8_ =
         (((Interface_ProblemToPolicyDiscretePure *)(local_68._0_8_ + 0x10))->
         super_Interface_ProblemToPolicyDiscrete)._vptr_Interface_ProblemToPolicyDiscrete;
    asStack_40[0].pi_ =
         (sp_counted_base *)
         (((Interface_ProblemToPolicyDiscretePure *)(local_68._0_8_ + 0x18))->
         super_Interface_ProblemToPolicyDiscrete)._vptr_Interface_ProblemToPolicyDiscrete;
    if (asStack_40[0].pi_ == (sp_counted_base *)0x0) {
      local_68._24_8_ = (sp_counted_base *)0x0;
    }
    else {
      LOCK();
      (asStack_40[0].pi_)->use_count_ = (asStack_40[0].pi_)->use_count_ + 1;
      UNLOCK();
      LOCK();
      (asStack_40[0].pi_)->use_count_ = (asStack_40[0].pi_)->use_count_ + 1;
      UNLOCK();
      local_68._24_8_ = asStack_40[0].pi_;
    }
    local_48 = (sp_counted_base *)local_68._16_8_;
    psVar3 = boost::shared_ptr<JointPolicyDiscretePure>::operator=
                       (jpol,(shared_ptr<JointPolicyDiscretePure> *)(local_68 + 0x10));
    peVar1 = psVar3->px;
    boost::detail::shared_count::~shared_count((shared_count *)(local_68 + 0x18));
    boost::detail::shared_count::~shared_count(asStack_40);
    bVar2 = peVar1 != (element_type *)0x0;
    if (bVar2) {
      (*((Interface_ProblemToPolicyDiscrete *)local_68._0_8_)->
        _vptr_Interface_ProblemToPolicyDiscrete[3])();
      *value = in_XMM0_Qa;
      BGIPSolution::PopNextSolutionJPPV(this_00);
    }
  }
  boost::detail::shared_count::~shared_count((shared_count *)(local_68 + 8));
LAB_0042338e:
  if (-1 < this->_m_verbosity) {
    poVar4 = std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound found jpol ");
    pbVar5 = boost::operator<<(poVar4,jpol);
    std::operator<<(pbVar5," value ");
    poVar4 = std::ostream::_M_insert<double>(*value);
    poVar4 = std::operator<<(poVar4," and ");
    BGIPSolution::GetNrFoundSolutions(this_00);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," solutions left");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  this->_m_nrSolutionsComputed = this->_m_nrSolutionsComputed + 1;
  return bVar2;
}

Assistant:

bool GetNextJointPolicyAndValueSpecific(boost::shared_ptr<JointPolicyDiscretePure> &jpol, double &value)
    {
        // If we never solved this BG, do that now
        if(!_m_solved)
            Solve();
        // even if we have more solutions stored in the solution queue, we
        // don't know whether they are optimal, so we need to resolve to
        // make sure
        else
            ReSolve();

        bool foundSolution=false;

        // this requires some magic to make sure we return from
        // the correct pool, which depends on the JP type
        if(!this->IsEmptyJPPV())
        {                
            const boost::shared_ptr<JPPVValuePair> jppv=
                this->GetNextSolutionJPPV();
            //if((jpol=boost::dynamic_pointer_cast<JP>(jppv->GetJPPV())))
            if((jpol=boost::static_pointer_cast<JointPolicyDiscretePure>(jppv->GetJPPV())))
            {
                foundSolution=true;
                value=jppv->GetValue();
                this->PopNextSolutionJPPV();
            }
        }
        else if(!this->IsEmptyPJPDP())
        {
            boost::shared_ptr<PartialJPDPValuePair> jppv=
                this->GetNextSolutionPJPDP();
            //if((jpol=boost::dynamic_pointer_cast<JP>(jppv->GetJPol())))
            if((jpol=boost::static_pointer_cast<JointPolicyDiscretePure>(jppv->GetJPol())))
            {
                foundSolution=true;
                value=jppv->GetValue();
                this->PopNextSolutionPJPDP();
            }
        }
        else
        {
            jpol.reset();
            value=0;
        }
        if(_m_verbosity>=0)
            std::cout << "BGIP_SolverBranchAndBound found jpol "
                      << jpol << " value " << value << " and " 
                      << this->GetNrFoundSolutions()
                      << " solutions left" 
                      << std::endl;
        _m_nrSolutionsComputed++;

        return(foundSolution);
    }